

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O2

void CPU::WDC65816::ProcessorStorageConstructor::stack_relative_indexed_indirect
               (AccessType type,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPreviousPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationConstructStackRelative);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementData);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchData);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchDataThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()
            (target,OperationConstructStackRelativeIndexedIndirect);
  read_write(type,is8bit,target);
  return;
}

Assistant:

static void stack_relative_indexed_indirect(AccessType type, bool is8bit, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);			// SO.
		target(CycleFetchPreviousPCThrowaway);	// IO.

		target(OperationConstructStackRelative);
		target(CycleFetchIncrementData);		// AAL.
		target(CycleFetchData);					// AAH.
		target(CycleFetchDataThrowaway);		// IO.

		target(OperationConstructStackRelativeIndexedIndirect);
		read_write(type, is8bit, target);
	}